

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2f> *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  bool bVar2;
  float2 v;
  array<float,_2UL> local_18;
  
  local_18._M_elems._1_7_ = in_register_00000001;
  local_18._M_elems[0]._0_1_ = in_AL;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    bVar1 = true;
    bVar2 = false;
  }
  else {
    bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_18);
    if (!bVar1) {
      return bVar1;
    }
    *(float *)&value->contained = local_18._M_elems[0];
    *(float *)((long)&value->contained + 4) = local_18._M_elems[1];
    bVar2 = true;
    if (value->has_value_ != false) {
      return bVar1;
    }
  }
  value->has_value_ = bVar2;
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}